

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surface_count_quantity.cpp
# Opt level: O3

void __thiscall
polyscope::SurfaceCountQuantity::setUniforms(SurfaceCountQuantity *this,ShaderProgram *p)

{
  bool bVar1;
  float fVar2;
  vec4 vVar3;
  mat4 Pinv;
  mat4 P;
  undefined1 *local_148 [2];
  undefined1 local_138 [16];
  undefined1 *local_128 [2];
  undefined1 local_118 [16];
  undefined1 *local_108 [2];
  undefined1 local_f8 [16];
  undefined1 *local_e8 [2];
  undefined1 local_d8 [16];
  undefined1 *local_c8 [2];
  undefined1 local_b8 [16];
  undefined1 local_a8 [64];
  mat<4,_4,_float,_(glm::qualifier)0> local_68;
  
  view::getCameraPerspectiveMatrix();
  glm::detail::compute_inverse<4,_4,_float,_(glm::qualifier)0,_false>::call(&local_68);
  local_c8[0] = local_b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"u_invProjMatrix","");
  (*p->_vptr_ShaderProgram[7])(p,(string *)local_c8,local_a8);
  if (local_c8[0] != local_b8) {
    operator_delete(local_c8[0]);
  }
  local_148[0] = local_138;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_148,"u_viewport","");
  vVar3 = render::Engine::getCurrentViewport(render::engine);
  (*p->_vptr_ShaderProgram[10])(vVar3._0_8_,vVar3._8_8_,p,local_148);
  if (local_148[0] != local_138) {
    operator_delete(local_148[0]);
  }
  local_e8[0] = local_d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"u_pointRadius","");
  bVar1 = (this->pointRadius).value.relativeFlag;
  fVar2 = (this->pointRadius).value.value;
  (*p->_vptr_ShaderProgram[5])
            ((ulong)((uint)(bVar1 & 1) * (int)(float)((double)fVar2 * state::lengthScale) +
                    (uint)!(bool)(bVar1 & 1) * (int)fVar2),p,(string *)local_e8);
  if (local_e8[0] != local_d8) {
    operator_delete(local_e8[0]);
  }
  local_108[0] = local_f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"u_rangeLow","");
  (*p->_vptr_ShaderProgram[5])((ulong)(uint)this->vizRangeLow,p,(string *)local_108);
  if (local_108[0] != local_f8) {
    operator_delete(local_108[0]);
  }
  local_128[0] = local_118;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"u_rangeHigh","");
  (*p->_vptr_ShaderProgram[5])((ulong)(uint)this->vizRangeHigh,p,(string *)local_128);
  if (local_128[0] != local_118) {
    operator_delete(local_128[0]);
  }
  return;
}

Assistant:

void SurfaceCountQuantity::setUniforms(render::ShaderProgram& p) {
  glm::mat4 P = view::getCameraPerspectiveMatrix();
  glm::mat4 Pinv = glm::inverse(P);
  p.setUniform("u_invProjMatrix", glm::value_ptr(Pinv));
  p.setUniform("u_viewport", render::engine->getCurrentViewport());

  p.setUniform("u_pointRadius", pointRadius.get().asAbsolute());
  p.setUniform("u_rangeLow", vizRangeLow);
  p.setUniform("u_rangeHigh", vizRangeHigh);
}